

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.h
# Opt level: O3

set<Token,_std::less<Token>,_std::allocator<Token>_> * __thiscall
Thread::extractTokens
          (set<Token,_std::less<Token>,_std::allocator<Token>_> *__return_storage_ptr__,Thread *this
          )

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &this->selftext,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->title);
  ResponseBase::extractTokensFromLine
            (__return_storage_ptr__,(ResponseBase *)this,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<Token> extractTokens() const {
			return extractTokensFromLine(selftext + title);
		}